

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_set_gej_var(secp256k1_ge *r,secp256k1_gej *a)

{
  int iVar1;
  long in_RDI;
  secp256k1_fe z3;
  secp256k1_fe z2;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  secp256k1_gej *in_stack_ffffffffffffff90;
  
  secp256k1_gej_verify(in_stack_ffffffffffffff90);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x109b82);
  if (iVar1 == 0) {
    *(undefined4 *)(in_RDI + 0x60) = 0;
    secp256k1_fe_inv_var
              (&in_stack_ffffffffffffff90->x,
               (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    secp256k1_fe_sqr(&in_stack_ffffffffffffff90->x,
                     (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    secp256k1_fe_mul(&in_stack_ffffffffffffff90->x,
                     (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (secp256k1_fe *)0x109be4);
    secp256k1_fe_mul(&in_stack_ffffffffffffff90->x,
                     (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (secp256k1_fe *)0x109bf8);
    secp256k1_fe_mul(&in_stack_ffffffffffffff90->x,
                     (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (secp256k1_fe *)0x109c14);
    secp256k1_fe_set_int(&in_stack_ffffffffffffff90->x,in_stack_ffffffffffffff8c);
    secp256k1_ge_set_xy((secp256k1_ge *)in_stack_ffffffffffffff90,
                        (secp256k1_fe *)
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                        (secp256k1_fe *)0x109c3f);
    secp256k1_ge_verify((secp256k1_ge *)in_stack_ffffffffffffff90);
  }
  else {
    secp256k1_ge_set_infinity((secp256k1_ge *)0x109b91);
  }
  return;
}

Assistant:

static void secp256k1_ge_set_gej_var(secp256k1_ge *r, secp256k1_gej *a) {
    secp256k1_fe z2, z3;
    secp256k1_gej_verify(a);
    if (secp256k1_gej_is_infinity(a)) {
        secp256k1_ge_set_infinity(r);
        return;
    }
    r->infinity = 0;
    secp256k1_fe_inv_var(&a->z, &a->z);
    secp256k1_fe_sqr(&z2, &a->z);
    secp256k1_fe_mul(&z3, &a->z, &z2);
    secp256k1_fe_mul(&a->x, &a->x, &z2);
    secp256k1_fe_mul(&a->y, &a->y, &z3);
    secp256k1_fe_set_int(&a->z, 1);
    secp256k1_ge_set_xy(r, &a->x, &a->y);
    secp256k1_ge_verify(r);
}